

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  int *pInLimit;
  BYTE *pBVar1;
  BYTE *pBVar2;
  int *piVar3;
  undefined8 *puVar4;
  uint uVar5;
  U32 hBits;
  int iVar6;
  BYTE *pBVar7;
  U32 *pUVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  int *piVar13;
  size_t sVar14;
  size_t sVar15;
  BYTE *pBVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int *piVar20;
  int *piVar21;
  BYTE *pBVar22;
  ulong uVar23;
  seqDef *psVar24;
  BYTE *pBVar25;
  ulong uVar26;
  long lVar27;
  int *piVar28;
  int *piVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  BYTE *litEnd;
  long lVar34;
  uint uVar35;
  U32 UVar36;
  U32 UVar37;
  int *piVar38;
  uint local_e0;
  ulong local_b8;
  BYTE *litLimit_w;
  
  uVar35 = (ms->cParams).targetLength;
  uVar35 = uVar35 + (uVar35 == 0);
  pBVar7 = (ms->window).base;
  pInLimit = (int *)((long)src + srcSize);
  uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar33 = (int)pBVar7;
  iVar17 = (int)pInLimit - iVar33;
  uVar5 = (ms->window).lowLimit;
  uVar9 = uVar5;
  if (uVar11 < iVar17 - uVar5) {
    uVar9 = iVar17 - uVar11;
  }
  if (ms->loadedDictEnd != 0) {
    uVar9 = uVar5;
  }
  pUVar8 = ms->hashTable;
  piVar3 = (int *)((long)src + (srcSize - 8));
  hBits = (ms->cParams).hashLog;
  uVar5 = (ms->window).dictLimit;
  uVar12 = *rep;
  uVar18 = rep[1];
  piVar20 = (int *)src;
  local_e0 = uVar18;
  if (uVar9 < uVar5) {
    pBVar16 = (ms->window).dictBase;
    pBVar1 = pBVar7 + uVar5;
    piVar13 = (int *)(pBVar16 + uVar5);
    piVar28 = pInLimit + -8;
LAB_001450f1:
    do {
      if (piVar3 <= src) {
        *rep = uVar12;
LAB_00145d5f:
        rep[1] = local_e0;
        return (long)pInLimit - (long)piVar20;
      }
      sVar14 = ZSTD_hashPtr(src,hBits,mls);
      uVar11 = pUVar8[sVar14];
      pBVar22 = pBVar16;
      if (uVar5 <= uVar11) {
        pBVar22 = pBVar7;
      }
      uVar31 = (long)src - (long)pBVar7;
      UVar36 = (U32)uVar31;
      uVar18 = UVar36 + 1;
      pBVar25 = pBVar16;
      if (uVar5 <= uVar18 - uVar12) {
        pBVar25 = pBVar7;
      }
      pUVar8[sVar14] = UVar36;
      uVar19 = uVar18 - uVar12;
      if (uVar18 < uVar12) {
        __assert_fail("offset_1 <= current +1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3e88,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      if (((uVar9 < uVar19) && (2 < (uVar5 - 1) - uVar19)) &&
         (*(int *)(pBVar25 + (uVar18 - uVar12)) == *(int *)((long)src + 1))) {
        piVar38 = pInLimit;
        if (uVar19 < uVar5) {
          piVar38 = piVar13;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 5),
                            (BYTE *)((long)(pBVar25 + (uVar18 - uVar12)) + 4),(BYTE *)pInLimit,
                            (BYTE *)piVar38,pBVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00145dd7;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00145df6;
        piVar38 = (int *)((long)src + 1);
        uVar23 = (long)piVar38 - (long)piVar20;
        pBVar22 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar22 + uVar23) goto LAB_00145e15;
        if (pInLimit < piVar38) goto LAB_00145e34;
        if (piVar28 < piVar38) {
          ZSTD_safecopyLiterals(pBVar22,(BYTE *)piVar20,(BYTE *)piVar38,(BYTE *)piVar28);
LAB_0014523b:
          seqStore->lit = seqStore->lit + uVar23;
          if (0xffff < uVar23) {
            if (seqStore->longLengthID != 0) goto LAB_00145e72;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar10 = *(undefined8 *)(piVar20 + 2);
          *(undefined8 *)pBVar22 = *(undefined8 *)piVar20;
          *(undefined8 *)(pBVar22 + 8) = uVar10;
          pBVar22 = seqStore->lit;
          if (0x10 < uVar23) {
            lVar34 = (long)(pBVar22 + 0x10) - (long)(piVar20 + 4);
            if (lVar34 < 8) {
              if (-0x10 < lVar34) goto LAB_00145eb0;
            }
            else if (0xffffffffffffffe0 < lVar34 - 0x10U) goto LAB_00145ecf;
            uVar10 = *(undefined8 *)(piVar20 + 6);
            *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(piVar20 + 4);
            *(undefined8 *)(pBVar22 + 0x18) = uVar10;
            if (0x20 < (long)uVar23) {
              lVar34 = 0;
              do {
                puVar4 = (undefined8 *)((long)piVar20 + lVar34 + 0x20);
                uVar10 = puVar4[1];
                pBVar25 = pBVar22 + lVar34 + 0x20;
                *(undefined8 *)pBVar25 = *puVar4;
                *(undefined8 *)(pBVar25 + 8) = uVar10;
                puVar4 = (undefined8 *)((long)piVar20 + lVar34 + 0x30);
                uVar10 = puVar4[1];
                *(undefined8 *)(pBVar25 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar25 + 0x18) = uVar10;
                lVar34 = lVar34 + 0x20;
              } while (pBVar25 + 0x20 < pBVar22 + uVar23);
            }
            goto LAB_0014523b;
          }
          seqStore->lit = pBVar22 + uVar23;
        }
        psVar24 = seqStore->sequences;
        psVar24->litLength = (U16)uVar23;
        psVar24->offset = 1;
        if (0xffff < sVar14 + 1) {
          if (seqStore->longLengthID != 0) goto LAB_00145e53;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->matchLength = (U16)(sVar14 + 1);
        psVar24 = psVar24 + 1;
        seqStore->sequences = psVar24;
        src = (void *)((long)piVar38 + sVar14 + 4);
        uVar11 = uVar12;
      }
      else {
        if ((uVar11 < uVar9) || (piVar38 = (int *)(pBVar22 + uVar11), *piVar38 != *src)) {
          src = (void *)((long)src + ((long)src - (long)piVar20 >> 8) + (ulong)uVar35);
          goto LAB_001450f1;
        }
        pBVar22 = pBVar1;
        piVar29 = pInLimit;
        if (uVar11 < uVar5) {
          pBVar22 = pBVar16 + uVar9;
          piVar29 = piVar13;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)(piVar38 + 1),(BYTE *)pInLimit,
                            (BYTE *)piVar29,pBVar1);
        for (lVar34 = 0;
            ((piVar29 = (int *)((long)src + lVar34), pBVar22 < (BYTE *)((long)piVar38 + lVar34) &&
             (piVar20 < piVar29)) &&
            (*(BYTE *)((long)src + lVar34 + -1) == *(BYTE *)((long)piVar38 + lVar34 + -1)));
            lVar34 = lVar34 + -1) {
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00145dd7;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00145df6;
        pBVar25 = seqStore->lit;
        pBVar22 = (BYTE *)((long)src + (lVar34 - (long)piVar20));
        if (seqStore->litStart + seqStore->maxNbLit < pBVar25 + (long)pBVar22) goto LAB_00145e15;
        if (pInLimit < piVar29) goto LAB_00145e34;
        uVar23 = (long)piVar29 - (long)piVar20;
        if (piVar28 < piVar29) {
          ZSTD_safecopyLiterals(pBVar25,(BYTE *)piVar20,(BYTE *)piVar29,(BYTE *)piVar28);
LAB_00145377:
          seqStore->lit = seqStore->lit + (long)((long)src + (lVar34 - (long)piVar20));
          if (0xffff < uVar23) {
            if (seqStore->longLengthID != 0) goto LAB_00145e72;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar10 = *(undefined8 *)(piVar20 + 2);
          *(undefined8 *)pBVar25 = *(undefined8 *)piVar20;
          *(undefined8 *)(pBVar25 + 8) = uVar10;
          pBVar25 = seqStore->lit;
          if (0x10 < uVar23) {
            lVar27 = (long)(pBVar25 + 0x10) - (long)(piVar20 + 4);
            if (lVar27 < 8) {
              if (-0x10 < lVar27) goto LAB_00145eb0;
            }
            else if (0xffffffffffffffe0 < lVar27 - 0x10U) goto LAB_00145ecf;
            uVar10 = *(undefined8 *)(piVar20 + 6);
            *(undefined8 *)(pBVar25 + 0x10) = *(undefined8 *)(piVar20 + 4);
            *(undefined8 *)(pBVar25 + 0x18) = uVar10;
            if (0x20 < (long)uVar23) {
              lVar27 = 0;
              do {
                puVar4 = (undefined8 *)((long)piVar20 + lVar27 + 0x20);
                uVar10 = puVar4[1];
                pBVar2 = pBVar25 + lVar27 + 0x20;
                *(undefined8 *)pBVar2 = *puVar4;
                *(undefined8 *)(pBVar2 + 8) = uVar10;
                puVar4 = (undefined8 *)((long)piVar20 + lVar27 + 0x30);
                uVar10 = puVar4[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar2 + 0x18) = uVar10;
                lVar27 = lVar27 + 0x20;
              } while (pBVar2 + 0x20 < pBVar25 + (long)pBVar22);
            }
            goto LAB_00145377;
          }
          seqStore->lit = pBVar25 + (long)pBVar22;
        }
        psVar24 = seqStore->sequences;
        psVar24->litLength = (short)lVar34 + ((short)src - (short)piVar20);
        psVar24->offset = (UVar36 - uVar11) + 3;
        if (0xffff < (sVar14 - lVar34) + 1) {
          if (seqStore->longLengthID != 0) goto LAB_00145e53;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->matchLength = ((short)sVar14 - (short)lVar34) + 1;
        psVar24 = psVar24 + 1;
        seqStore->sequences = psVar24;
        src = (void *)((long)piVar29 + (sVar14 - lVar34) + 4);
        uVar11 = UVar36 - uVar11;
        local_e0 = uVar12;
      }
      piVar20 = (int *)src;
      uVar12 = uVar11;
      if (src <= piVar3) {
        sVar14 = ZSTD_hashPtr(pBVar7 + (uVar31 & 0xffffffff) + 2,hBits,mls);
        pUVar8[sVar14] = UVar36 + 2;
        sVar14 = ZSTD_hashPtr((BYTE *)((long)src + -2),hBits,mls);
        pUVar8[sVar14] = (int)(BYTE *)((long)src + -2) - iVar33;
        for (; uVar12 = uVar11, piVar20 = (int *)src, src <= piVar3;
            src = (void *)((long)src + sVar14 + 4)) {
          UVar36 = (int)src - iVar33;
          uVar11 = UVar36 - local_e0;
          pBVar22 = pBVar7;
          if (uVar11 < uVar5) {
            pBVar22 = pBVar16;
          }
          if (((uVar11 <= uVar9) || ((uVar5 - 1) - uVar11 < 3)) ||
             (*(int *)(pBVar22 + uVar11) != *src)) break;
          piVar20 = pInLimit;
          if (uVar11 < uVar5) {
            piVar20 = piVar13;
          }
          sVar14 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar22 + uVar11) + 4),
                              (BYTE *)pInLimit,(BYTE *)piVar20,pBVar1);
          if (seqStore->maxNbSeq <= (ulong)((long)psVar24 - (long)seqStore->sequencesStart >> 3))
          goto LAB_00145dd7;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00145df6;
          pBVar22 = seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < pBVar22) goto LAB_00145e15;
          if (pInLimit < src) goto LAB_00145e34;
          if (piVar28 < src) {
            ZSTD_safecopyLiterals(pBVar22,(BYTE *)src,(BYTE *)src,(BYTE *)piVar28);
          }
          else {
            uVar10 = *(undefined8 *)((long)src + 8);
            *(undefined8 *)pBVar22 = *src;
            *(undefined8 *)(pBVar22 + 8) = uVar10;
          }
          psVar24 = seqStore->sequences;
          psVar24->litLength = 0;
          psVar24->offset = 1;
          if (0xffff < sVar14 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_00145e53;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar24->matchLength = (U16)(sVar14 + 1);
          psVar24 = psVar24 + 1;
          seqStore->sequences = psVar24;
          sVar15 = ZSTD_hashPtr(src,hBits,mls);
          pUVar8[sVar15] = UVar36;
          uVar11 = local_e0;
          local_e0 = uVar12;
        }
      }
    } while( true );
  }
  uVar9 = iVar17 - uVar11;
  if (iVar17 - uVar5 <= uVar11) {
    uVar9 = uVar5;
  }
  pBVar1 = pBVar7 + uVar9;
  piVar28 = (int *)((long)src + (ulong)(pBVar1 == (BYTE *)src));
  uVar11 = (int)piVar28 - (int)pBVar1;
  uVar5 = 0;
  if (uVar11 < uVar18) {
    local_e0 = 0;
    uVar5 = uVar18;
  }
  uVar18 = uVar12;
  if (uVar11 < uVar12) {
    uVar18 = 0;
    uVar5 = uVar12;
  }
  local_b8 = (ulong)uVar18;
  piVar38 = (int *)((long)src + (ulong)(pBVar1 == (BYTE *)src) + 1);
  piVar13 = pInLimit + -8;
  do {
    lVar34 = -local_b8;
    while( true ) {
      uVar11 = (uint)local_b8;
      if (piVar3 <= piVar38) {
        if (uVar11 == 0) {
          uVar11 = uVar5;
        }
        *rep = uVar11;
        if (local_e0 == 0) {
          local_e0 = uVar5;
        }
        goto LAB_00145d5f;
      }
      sVar14 = ZSTD_hashPtr(piVar28,hBits,mls);
      iVar17 = *piVar28;
      sVar15 = ZSTD_hashPtr(piVar38,hBits,mls);
      iVar6 = *piVar38;
      uVar31 = (long)piVar28 - (long)pBVar7;
      iVar30 = (int)piVar38;
      uVar12 = pUVar8[sVar14];
      uVar18 = pUVar8[sVar15];
      UVar36 = (U32)uVar31;
      pUVar8[sVar14] = UVar36;
      pUVar8[sVar15] = iVar30 - iVar33;
      if ((int *)((long)piVar28 + 1) != piVar38) {
        __assert_fail("ip0 + 1 == ip1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3d56,
                      "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      if ((uVar11 != 0) && (*(int *)((long)piVar28 + lVar34 + 2) == *(int *)((long)piVar28 + 2))) {
        uVar23 = (ulong)(*(BYTE *)((long)piVar28 + 1) == *(BYTE *)((long)piVar28 + lVar34 + 1));
        piVar29 = (int *)((long)piVar28 + (2 - uVar23));
        pBVar16 = (BYTE *)((long)piVar28 + ((lVar34 + 2) - uVar23));
        UVar37 = 1;
        goto LAB_001459a1;
      }
      if ((uVar9 < uVar12) && (piVar21 = (int *)(pBVar7 + uVar12), *piVar21 == iVar17)) break;
      if ((uVar9 < uVar18) && (piVar21 = (int *)(pBVar7 + uVar18), *piVar21 == iVar6))
      goto LAB_00145956;
      uVar31 = ((ulong)((long)piVar28 - (long)piVar20) >> 7) + (ulong)(uVar35 + 1);
      if (uVar31 < 2) {
        __assert_fail("step >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3d6a,
                      "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      piVar28 = (int *)((long)piVar28 + uVar31);
      piVar38 = (int *)((long)piVar38 + uVar31);
    }
    iVar30 = (int)piVar28;
    piVar38 = piVar28;
LAB_00145956:
    uVar12 = iVar30 - (int)piVar21;
    local_b8 = (ulong)uVar12;
    lVar34 = 0;
    while( true ) {
      pBVar16 = (BYTE *)((long)piVar21 + lVar34);
      piVar29 = (int *)((long)piVar38 + lVar34);
      if (((pBVar16 <= pBVar1) || (piVar29 <= piVar20)) ||
         (*(BYTE *)((long)piVar38 + lVar34 + -1) != *(BYTE *)((long)piVar21 + lVar34 + -1))) break;
      lVar34 = lVar34 + -1;
    }
    UVar37 = uVar12 + 3;
    uVar23 = -lVar34;
    local_e0 = uVar11;
LAB_001459a1:
    sVar14 = ZSTD_count((BYTE *)((long)piVar29 + uVar23 + 4),pBVar16 + uVar23 + 4,(BYTE *)pInLimit);
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00145dd7:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_00145df6:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar32 = (long)piVar29 - (long)piVar20;
    pBVar16 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar16 + uVar32) {
LAB_00145e15:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < piVar29) {
LAB_00145e34:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (piVar13 < piVar29) {
      ZSTD_safecopyLiterals(pBVar16,(BYTE *)piVar20,(BYTE *)piVar29,(BYTE *)piVar13);
LAB_00145a27:
      seqStore->lit = seqStore->lit + uVar32;
      if (0xffff < uVar32) {
        if (seqStore->longLengthID != 0) {
LAB_00145e72:
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar10 = *(undefined8 *)(piVar20 + 2);
      *(undefined8 *)pBVar16 = *(undefined8 *)piVar20;
      *(undefined8 *)(pBVar16 + 8) = uVar10;
      pBVar16 = seqStore->lit;
      if (0x10 < uVar32) {
        lVar34 = (long)(pBVar16 + 0x10) - (long)(piVar20 + 4);
        if (lVar34 < 8) {
          if (-0x10 < lVar34) {
LAB_00145eb0:
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar34 - 0x10U) {
LAB_00145ecf:
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar10 = *(undefined8 *)(piVar20 + 6);
        *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(piVar20 + 4);
        *(undefined8 *)(pBVar16 + 0x18) = uVar10;
        if (0x20 < (long)uVar32) {
          lVar34 = 0;
          do {
            puVar4 = (undefined8 *)((long)piVar20 + lVar34 + 0x20);
            uVar10 = puVar4[1];
            pBVar22 = pBVar16 + lVar34 + 0x20;
            *(undefined8 *)pBVar22 = *puVar4;
            *(undefined8 *)(pBVar22 + 8) = uVar10;
            puVar4 = (undefined8 *)((long)piVar20 + lVar34 + 0x30);
            uVar10 = puVar4[1];
            *(undefined8 *)(pBVar22 + 0x10) = *puVar4;
            *(undefined8 *)(pBVar22 + 0x18) = uVar10;
            lVar34 = lVar34 + 0x20;
          } while (pBVar22 + 0x20 < pBVar16 + uVar32);
        }
        goto LAB_00145a27;
      }
      seqStore->lit = pBVar16 + uVar32;
    }
    uVar26 = uVar23 + sVar14 + 1;
    psVar24 = seqStore->sequences;
    psVar24->litLength = (U16)uVar32;
    psVar24->offset = UVar37;
    if (0xffff < uVar26) {
      if (seqStore->longLengthID != 0) {
LAB_00145e53:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar24->matchLength = (U16)uVar26;
    psVar24 = psVar24 + 1;
    seqStore->sequences = psVar24;
    piVar28 = (int *)((long)piVar29 + uVar23 + sVar14 + 4);
    piVar38 = (int *)((long)piVar29 + uVar23 + sVar14 + 5);
    piVar20 = piVar28;
    if (piVar28 <= piVar3) {
      if (pBVar7 + (uVar31 & 0xffffffff) + 2 <= src) {
        __assert_fail("base+current0+2 > istart",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3d84,
                      "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      sVar14 = ZSTD_hashPtr(pBVar7 + (uVar31 & 0xffffffff) + 2,hBits,mls);
      pUVar8[sVar14] = UVar36 + 2;
      sVar14 = ZSTD_hashPtr((BYTE *)((long)piVar28 + -2),hBits,mls);
      pUVar8[sVar14] = (int)(BYTE *)((long)piVar28 + -2) - iVar33;
      while( true ) {
        uVar11 = (uint)local_b8;
        piVar20 = piVar28;
        if (((local_e0 == 0) || (piVar3 < piVar28)) ||
           (*piVar28 != *(int *)((long)piVar28 - (ulong)local_e0))) break;
        sVar14 = ZSTD_count((BYTE *)(piVar28 + 1),(BYTE *)((long)piVar28 + (4 - (ulong)local_e0)),
                            (BYTE *)pInLimit);
        sVar15 = ZSTD_hashPtr(piVar28,hBits,mls);
        pUVar8[sVar15] = (int)piVar28 - iVar33;
        if (seqStore->maxNbSeq <= (ulong)((long)psVar24 - (long)seqStore->sequencesStart >> 3))
        goto LAB_00145dd7;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00145df6;
        pBVar16 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar16) goto LAB_00145e15;
        if (pInLimit < piVar28) goto LAB_00145e34;
        if (piVar13 < piVar28) {
          ZSTD_safecopyLiterals(pBVar16,(BYTE *)piVar28,(BYTE *)piVar28,(BYTE *)piVar13);
        }
        else {
          uVar10 = *(undefined8 *)(piVar28 + 2);
          *(undefined8 *)pBVar16 = *(undefined8 *)piVar28;
          *(undefined8 *)(pBVar16 + 8) = uVar10;
        }
        psVar24 = seqStore->sequences;
        psVar24->litLength = 0;
        psVar24->offset = 1;
        if (0xffff < sVar14 + 1) {
          if (seqStore->longLengthID != 0) goto LAB_00145e53;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        piVar38 = (int *)((long)piVar28 + sVar14 + 5);
        piVar28 = (int *)((long)piVar28 + sVar14 + 4);
        psVar24->matchLength = (U16)(sVar14 + 1);
        psVar24 = psVar24 + 1;
        seqStore->sequences = psVar24;
        local_b8 = (ulong)local_e0;
        local_e0 = uVar11;
      }
    }
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic");

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, mls);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    current = (U32)(ip-base);
        const U32    repIndex = current + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        hashTable[h] = current;   /* update hash table */
        assert(offset_1 <= current +1);   /* check repIndex */

        if ( (((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */ & (repIndex > dictStartIndex))
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* const repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            size_t const rLength = ZSTD_count_2segments(ip+1 +4, repMatch +4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, rLength-MINMATCH);
            ip += rLength;
            anchor = ip;
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 const offset = current - matchIndex;
                size_t mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset_2 = offset_1; offset_1 = offset;  /* update offset history */
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
                ip += mLength;
                anchor = ip;
        }   }

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+current+2, hlog, mls)] = current+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (repIndex2 > dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, 0 /*offcode*/, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}